

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse.h
# Opt level: O2

void sse::common::zero<long>(long *pDst,int len)

{
  long *plVar1;
  int iVar2;
  
  plVar1 = pDst;
  for (iVar2 = len >> 1; 3 < iVar2; iVar2 = iVar2 + -4) {
    plVar1[6] = 0;
    plVar1[7] = 0;
    plVar1[4] = 0;
    plVar1[5] = 0;
    plVar1[2] = 0;
    plVar1[3] = 0;
    *plVar1 = 0;
    plVar1[1] = 0;
    plVar1 = plVar1 + 8;
  }
  if (1 < iVar2) {
    iVar2 = iVar2 + -2;
    plVar1[2] = 0;
    plVar1[3] = 0;
    *plVar1 = 0;
    plVar1[1] = 0;
    plVar1 = plVar1 + 4;
  }
  if (iVar2 != 0) {
    *plVar1 = 0;
    plVar1[1] = 0;
  }
  if (len != 0) {
    pDst[(long)len + -1] = 0;
  }
  return;
}

Assistant:

_SIMD_SSE_T void zero(_T* pDst, int len)
        {
            set<_T>((_T)0, pDst, len);
        }